

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pSVar1;
  Table *x__1;
  LClosure *o;
  TString *v;
  Upvaldesc *pUVar2;
  LClosure *x_;
  LexState lexstate;
  BlockCnt bl;
  FuncState funcstate;
  LexState local_108;
  BlockCnt local_98;
  FuncState local_80;
  
  o = luaF_newLclosure(L,1);
  pSVar1 = (L->top).p;
  *(LClosure **)pSVar1 = o;
  (pSVar1->val).tt_ = 'F';
  luaD_inctop(L);
  local_108.h = luaH_new(L);
  pSVar1 = (L->top).p;
  (pSVar1->val).value_.gc = (GCObject *)local_108.h;
  (pSVar1->val).tt_ = 'E';
  luaD_inctop(L);
  local_80.f = luaF_newproto(L);
  o->p = local_80.f;
  if (((o->marked & 0x20) != 0) && (((local_80.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(GCObject *)local_80.f);
  }
  v = luaS_new(L,name);
  (local_80.f)->source = v;
  if ((((local_80.f)->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)local_80.f,(GCObject *)v);
  }
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  local_108.buff = buff;
  local_108.dyd = dyd;
  luaX_setinput(L,&local_108,z,(local_80.f)->source,firstchar);
  open_func(&local_108,&local_80,&local_98);
  (local_80.f)->flag = (local_80.f)->flag | 1;
  luaK_codeABCk(&local_80,OP_VARARGPREP,0,0,0,0);
  pUVar2 = allocupvalue(&local_80);
  pUVar2->instack = '\x01';
  pUVar2->idx = '\0';
  pUVar2->kind = '\0';
  pUVar2->name = local_108.envn;
  if ((((local_80.f)->marked & 0x20) != 0) && (((local_108.envn)->marked & 0x18) != 0)) {
    luaC_barrier_(local_108.L,(GCObject *)local_80.f,(GCObject *)local_108.envn);
  }
  luaX_next(&local_108);
  statlist(&local_108);
  if (local_108.t.token == 0x120) {
    close_func(&local_108);
    (L->top).p = (StkId)((L->top).offset + -0x10);
    return o;
  }
  error_expected(&local_108,0x120);
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue2s(L, L->top.p, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue2s(L, L->top.p, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  luaC_objbarrier(L, funcstate.f, funcstate.f->source);
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top.p--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}